

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  ostream *poVar1;
  bool bVar2;
  allocator<char> local_51;
  string local_50 [36];
  uint local_2c;
  aiFace *paStack_28;
  uint c;
  aiFace *f;
  uint i;
  uint offset_local;
  aiMesh *m_local;
  PlyExporter *this_local;
  
  f._4_4_ = offset;
  _i = m;
  m_local = (aiMesh *)this;
  for (f._0_4_ = 0; (uint)f < _i->mNumFaces; f._0_4_ = (uint)f + 1) {
    paStack_28 = _i->mFaces + (uint)f;
    poVar1 = (ostream *)std::ostream::operator<<(this,paStack_28->mNumIndices);
    std::operator<<(poVar1," ");
    for (local_2c = 0; local_2c < paStack_28->mNumIndices; local_2c = local_2c + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(this,paStack_28->mIndices[local_2c] + f._4_4_);
      bVar2 = local_2c != paStack_28->mNumIndices - 1;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_50," ",&local_51);
      }
      else {
        std::__cxx11::string::string(local_50,(string *)&this->endl);
      }
      std::operator<<(poVar1,local_50);
      std::__cxx11::string::~string(local_50);
      if (bVar2) {
        std::allocator<char>::~allocator(&local_51);
      }
    }
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices << " ";
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << (f.mIndices[c] + offset) << (c == f.mNumIndices-1 ? endl : " ");
        }
    }
}